

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreCubeCheckTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_PtrAre_t GVar5;
  
  do {
    uVar1 = *(uint *)pObj;
    uVar2 = *(uint *)(&pSta[1].iPrev.field_0x0 + (uVar1 >> 2 & 0xffc));
    uVar4 = uVar1 * 2 & 0x1e;
    if ((uVar2 >> uVar4 & 1) == 0) {
      if ((uVar2 >> (sbyte)uVar4 & 2) != 0) {
        uVar1 = uVar1 & 0x3f00000;
        GVar5 = pObj->F[1];
        goto LAB_0073b0af;
      }
    }
    else {
      uVar1 = uVar1 & 0xfc000;
      GVar5 = pObj->F[0];
LAB_0073b0af:
      if (((uint)GVar5 & 0x7fffffff) == 0 || uVar1 != 0) {
        iVar3 = Gia_ManAreCubeCheckList(p,(Gia_PtrAre_t *)(ulong)(uint)GVar5,pSta);
      }
      else {
        iVar3 = Gia_ManAreCubeCheckTree_rec
                          (p,(Gia_ObjAre_t *)
                             ((ulong)(((uint)GVar5 & 0xfffff) << 4) +
                             *(long *)((long)p->ppObjs + (ulong)((uint)GVar5 >> 0x11 & 0x3ff8))),
                           pSta);
      }
      if (iVar3 == 0) {
        return 0;
      }
    }
    GVar5 = pObj->F[2];
    if ((0x3ffffff < *(uint *)pObj) || (((uint)GVar5 & 0x7fffffff) == 0)) {
      iVar3 = Gia_ManAreCubeCheckList(p,(Gia_PtrAre_t *)(ulong)(uint)GVar5,pSta);
      return iVar3;
    }
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)GVar5 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)GVar5 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

int Gia_ManAreCubeCheckTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    int RetValue;
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F + 1, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    if ( Gia_ObjHasBranch2(pObj) )
        return Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
    return Gia_ManAreCubeCheckList( p, pObj->F + 2, pSta );
}